

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_cheat.cpp
# Opt level: O3

void cht_Take(player_t *player,char *name,int amount)

{
  APlayerPawn *pAVar1;
  _func_int *UNRECOVERED_JUMPTABLE;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  PClassActor *pPVar6;
  AInventory *pAVar7;
  PClassActor *pPVar8;
  PClassActor *pPVar9;
  ulong uVar10;
  ulong uVar11;
  
  pAVar1 = player->mo;
  if (pAVar1 == (APlayerPawn *)0x0) {
    return;
  }
  iVar4 = player->health;
  if (iVar4 < 1) {
    return;
  }
  iVar2 = strcasecmp(name,"all");
  if (iVar2 == 0) {
LAB_003a23eb:
    if (PClassActor::AllActorClasses.Count == 0) {
      uVar5 = 0;
    }
    else {
      uVar10 = 0;
      do {
        pPVar6 = PClassActor::AllActorClasses.Array[uVar10];
        pPVar8 = pPVar6;
        if (pPVar6 == (PClassActor *)ABackpackItem::RegistrationInfo.MyClass) {
LAB_003a2430:
          pAVar7 = AActor::FindInventory(&player->mo->super_AActor,pPVar6,false);
          if (pAVar7 != (AInventory *)0x0) {
            (*(pAVar7->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])(pAVar7);
          }
        }
        else {
          do {
            pPVar8 = (PClassActor *)(pPVar8->super_PClass).ParentClass;
            if (pPVar8 == (PClassActor *)ABackpackItem::RegistrationInfo.MyClass) break;
          } while (pPVar8 != (PClassActor *)0x0);
          if (pPVar8 != (PClassActor *)0x0) goto LAB_003a2430;
        }
        uVar10 = uVar10 + 1;
        uVar5 = PClassActor::AllActorClasses.Count;
      } while (uVar10 < PClassActor::AllActorClasses.Count);
    }
    if (iVar2 != 0) {
      return;
    }
LAB_003a24c9:
    if (uVar5 == 0) {
      uVar5 = 0;
    }
    else {
      uVar10 = 0;
      do {
        if (((PClassActor::AllActorClasses.Array[uVar10]->super_PClass).ParentClass ==
             AAmmo::RegistrationInfo.MyClass) &&
           (pAVar7 = AActor::FindInventory
                               (&player->mo->super_AActor,PClassActor::AllActorClasses.Array[uVar10]
                                ,false), pAVar7 != (AInventory *)0x0)) {
          (*(pAVar7->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x1a])(pAVar7);
        }
        uVar10 = uVar10 + 1;
        uVar5 = PClassActor::AllActorClasses.Count;
      } while (uVar10 < PClassActor::AllActorClasses.Count);
    }
    if (iVar2 != 0) {
      return;
    }
LAB_003a254d:
    if (uVar5 == 0) {
      uVar5 = 0;
    }
    else {
      uVar10 = 0;
      do {
        pPVar6 = PClassActor::AllActorClasses.Array[uVar10];
        pPVar8 = pPVar6;
        if (pPVar6 == (PClassActor *)AArmor::RegistrationInfo.MyClass) {
LAB_003a258b:
          pAVar7 = AActor::FindInventory(&player->mo->super_AActor,pPVar6,false);
          if (pAVar7 != (AInventory *)0x0) {
            (*(pAVar7->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x1a])(pAVar7);
          }
        }
        else {
          do {
            pPVar8 = (PClassActor *)(pPVar8->super_PClass).ParentClass;
            if (pPVar8 == (PClassActor *)AArmor::RegistrationInfo.MyClass) break;
          } while (pPVar8 != (PClassActor *)0x0);
          if (pPVar8 != (PClassActor *)0x0) goto LAB_003a258b;
        }
        uVar10 = uVar10 + 1;
        uVar5 = PClassActor::AllActorClasses.Count;
      } while (uVar10 < PClassActor::AllActorClasses.Count);
    }
    if (iVar2 != 0) {
      return;
    }
LAB_003a25ca:
    if (uVar5 == 0) {
      uVar10 = 0;
    }
    else {
      uVar11 = 0;
      do {
        pPVar6 = PClassActor::AllActorClasses.Array[uVar11];
        pPVar8 = pPVar6;
        if (pPVar6 == (PClassActor *)AKey::RegistrationInfo.MyClass) {
LAB_003a2608:
          pAVar7 = AActor::FindInventory(&player->mo->super_AActor,pPVar6,false);
          if (pAVar7 != (AInventory *)0x0) {
            (*(pAVar7->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])(pAVar7);
          }
        }
        else {
          do {
            pPVar8 = (PClassActor *)(pPVar8->super_PClass).ParentClass;
            if (pPVar8 == (PClassActor *)AKey::RegistrationInfo.MyClass) break;
          } while (pPVar8 != (PClassActor *)0x0);
          if (pPVar8 != (PClassActor *)0x0) goto LAB_003a2608;
        }
        uVar11 = uVar11 + 1;
        uVar10 = (ulong)PClassActor::AllActorClasses.Count;
      } while (uVar11 < uVar10);
    }
    if (iVar2 != 0) {
      return;
    }
LAB_003a2644:
    if ((int)uVar10 == 0) {
      uVar5 = 0;
    }
    else {
      uVar11 = 0;
      pPVar6 = (PClassActor *)AWeapon::RegistrationInfo.MyClass;
      do {
        pPVar8 = PClassActor::AllActorClasses.Array[uVar11];
        pPVar9 = pPVar8;
        if (pPVar8 != pPVar6) {
          do {
            pPVar9 = (PClassActor *)(pPVar9->super_PClass).ParentClass;
            if (pPVar9 == pPVar6) break;
          } while (pPVar9 != (PClassActor *)0x0);
          if (pPVar9 != (PClassActor *)0x0) {
            pAVar7 = AActor::FindInventory(&player->mo->super_AActor,pPVar8,false);
            if (pAVar7 != (AInventory *)0x0) {
              (*(pAVar7->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])(pAVar7);
            }
            player->ReadyWeapon = (AWeapon *)0x0;
            pPVar6 = (PClassActor *)AWeapon::RegistrationInfo.MyClass;
            player->PendingWeapon = (AWeapon *)AWeapon::RegistrationInfo.MyClass;
            uVar10 = (ulong)PClassActor::AllActorClasses.Count;
          }
        }
        uVar5 = (uint)uVar10;
        uVar11 = uVar11 + 1;
      } while (uVar11 < uVar10);
    }
    if (iVar2 != 0) {
      return;
    }
  }
  else {
    iVar3 = strcasecmp(name,"health");
    if (iVar3 == 0) {
      iVar2 = (pAVar1->super_AActor).health;
      iVar3 = iVar2 - amount;
      if ((iVar3 != 0 && amount <= iVar2) && (amount != 0 && amount < iVar4)) {
        if (amount < 1) {
          return;
        }
        (pAVar1->super_AActor).health = iVar3;
        player->health = iVar3;
        return;
      }
      cht_Suicide(player);
      if ((player_t *)(&players + (long)consoleplayer * 0x54) != player) {
        return;
      }
      C_HideConsole();
      return;
    }
    iVar4 = strcasecmp(name,"backpack");
    if (iVar4 == 0) goto LAB_003a23eb;
    iVar4 = strcasecmp(name,"ammo");
    uVar5 = PClassActor::AllActorClasses.Count;
    if (iVar4 == 0) goto LAB_003a24c9;
    iVar4 = strcasecmp(name,"armor");
    uVar5 = PClassActor::AllActorClasses.Count;
    if (iVar4 == 0) goto LAB_003a254d;
    iVar4 = strcasecmp(name,"keys");
    uVar5 = PClassActor::AllActorClasses.Count;
    if (iVar4 == 0) goto LAB_003a25ca;
    iVar4 = strcasecmp(name,"weapons");
    if (iVar4 == 0) {
      uVar10 = (ulong)PClassActor::AllActorClasses.Count;
      goto LAB_003a2644;
    }
    iVar4 = strcasecmp(name,"artifacts");
    uVar5 = PClassActor::AllActorClasses.Count;
    if (iVar4 != 0) {
      iVar4 = strcasecmp(name,"puzzlepieces");
      if (iVar4 != 0) {
        pPVar6 = PClass::FindActor(name);
        if (pPVar6 == (PClassActor *)0x0) {
LAB_003a28cf:
          if ((player_t *)(&players + (long)consoleplayer * 0x54) != player) {
            return;
          }
          Printf("Unknown item \"%s\"\n",name);
          return;
        }
        pPVar8 = pPVar6;
        if (pPVar6 != (PClassActor *)AInventory::RegistrationInfo.MyClass) {
          do {
            pPVar8 = (PClassActor *)(pPVar8->super_PClass).ParentClass;
            if (pPVar8 == (PClassActor *)AInventory::RegistrationInfo.MyClass) break;
          } while (pPVar8 != (PClassActor *)0x0);
          if (pPVar8 == (PClassActor *)0x0) goto LAB_003a28cf;
        }
        UNRECOVERED_JUMPTABLE =
             (player->mo->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x16];
        (*UNRECOVERED_JUMPTABLE)
                  (player->mo,pPVar6,(ulong)(amount + (uint)(amount == 0)),0,0,UNRECOVERED_JUMPTABLE
                  );
        return;
      }
      if (PClassActor::AllActorClasses.Count == 0) {
        return;
      }
      goto LAB_003a286f;
    }
  }
  if (uVar5 == 0) {
    return;
  }
  uVar10 = 0;
  do {
    pPVar6 = PClassActor::AllActorClasses.Array[uVar10];
    pPVar8 = pPVar6;
    if (pPVar6 == (PClassActor *)AInventory::RegistrationInfo.MyClass) {
LAB_003a273b:
      pPVar8 = pPVar6;
      if (pPVar6 != (PClassActor *)APuzzleItem::RegistrationInfo.MyClass) {
        do {
          pPVar8 = (PClassActor *)(pPVar8->super_PClass).ParentClass;
          if (pPVar8 == (PClassActor *)APuzzleItem::RegistrationInfo.MyClass) break;
        } while (pPVar8 != (PClassActor *)0x0);
        if ((pPVar8 == (PClassActor *)0x0) &&
           (pPVar8 = pPVar6, pPVar6 != (PClassActor *)APowerup::RegistrationInfo.MyClass)) {
          do {
            pPVar8 = (PClassActor *)(pPVar8->super_PClass).ParentClass;
            if (pPVar8 == (PClassActor *)APowerup::RegistrationInfo.MyClass) break;
          } while (pPVar8 != (PClassActor *)0x0);
          if ((pPVar8 == (PClassActor *)0x0) &&
             (pPVar8 = pPVar6, pPVar6 != (PClassActor *)AArmor::RegistrationInfo.MyClass)) {
            do {
              pPVar8 = (PClassActor *)(pPVar8->super_PClass).ParentClass;
              if (pPVar8 == (PClassActor *)AArmor::RegistrationInfo.MyClass) break;
            } while (pPVar8 != (PClassActor *)0x0);
            if ((pPVar8 == (PClassActor *)0x0) &&
               (pPVar8 = pPVar6, pPVar6 != (PClassActor *)AWeapon::RegistrationInfo.MyClass)) {
              do {
                pPVar8 = (PClassActor *)(pPVar8->super_PClass).ParentClass;
                if (pPVar8 == (PClassActor *)AWeapon::RegistrationInfo.MyClass) break;
              } while (pPVar8 != (PClassActor *)0x0);
              if ((pPVar8 == (PClassActor *)0x0) &&
                 (pPVar8 = pPVar6, pPVar6 != (PClassActor *)AKey::RegistrationInfo.MyClass)) {
                do {
                  pPVar8 = (PClassActor *)(pPVar8->super_PClass).ParentClass;
                  if (pPVar8 == (PClassActor *)AKey::RegistrationInfo.MyClass) break;
                } while (pPVar8 != (PClassActor *)0x0);
                if ((pPVar8 == (PClassActor *)0x0) &&
                   (pAVar7 = AActor::FindInventory(&player->mo->super_AActor,pPVar6,false),
                   pAVar7 != (AInventory *)0x0)) {
                  (*(pAVar7->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])(pAVar7);
                }
              }
            }
          }
        }
      }
    }
    else {
      do {
        pPVar8 = (PClassActor *)(pPVar8->super_PClass).ParentClass;
        if (pPVar8 == (PClassActor *)AInventory::RegistrationInfo.MyClass) break;
      } while (pPVar8 != (PClassActor *)0x0);
      if (pPVar8 != (PClassActor *)0x0) goto LAB_003a273b;
    }
    uVar10 = uVar10 + 1;
  } while (uVar10 < PClassActor::AllActorClasses.Count);
  if (iVar2 != 0 || PClassActor::AllActorClasses.Count == 0) {
    return;
  }
LAB_003a286f:
  uVar10 = 0;
  do {
    pPVar6 = PClassActor::AllActorClasses.Array[uVar10];
    pPVar8 = pPVar6;
    if (pPVar6 == (PClassActor *)APuzzleItem::RegistrationInfo.MyClass) {
LAB_003a28a9:
      pAVar7 = AActor::FindInventory(&player->mo->super_AActor,pPVar6,false);
      if (pAVar7 != (AInventory *)0x0) {
        (*(pAVar7->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])(pAVar7);
      }
    }
    else {
      do {
        pPVar8 = (PClassActor *)(pPVar8->super_PClass).ParentClass;
        if (pPVar8 == (PClassActor *)APuzzleItem::RegistrationInfo.MyClass) break;
      } while (pPVar8 != (PClassActor *)0x0);
      if (pPVar8 != (PClassActor *)0x0) goto LAB_003a28a9;
    }
    uVar10 = uVar10 + 1;
    if (PClassActor::AllActorClasses.Count <= uVar10) {
      return;
    }
  } while( true );
}

Assistant:

void cht_Take (player_t *player, const char *name, int amount)
{
	bool takeall;
	PClassActor *type;

	if (player->mo == NULL || player->health <= 0)
	{
		return;
	}

	takeall = (stricmp (name, "all") == 0);

	if (!takeall && stricmp (name, "health") == 0)
	{
		if (player->mo->health - amount <= 0
			|| player->health - amount <= 0
			|| amount == 0)
		{

			cht_Suicide (player);

			if (player == &players[consoleplayer])
				C_HideConsole ();

			return;
		}

		if (amount > 0)
		{
			if (player->mo)
			{
				player->mo->health -= amount;
	  			player->health = player->mo->health;
			}
			else
			{
				player->health -= amount;
			}
		}

		if (!takeall)
			return;
	}

	if (takeall || stricmp (name, "backpack") == 0)
	{
		// Take away all types of backpacks the player might own.
		for (unsigned int i = 0; i < PClassActor::AllActorClasses.Size(); ++i)
		{
			PClass *type = PClassActor::AllActorClasses[i];

			if (type->IsDescendantOf(RUNTIME_CLASS (ABackpackItem)))
			{
				AInventory *pack = player->mo->FindInventory(static_cast<PClassActor *>(type));

				if (pack)
					pack->Destroy();
			}
		}

		if (!takeall)
			return;
	}

	if (takeall || stricmp (name, "ammo") == 0)
	{
		for (unsigned int i = 0; i < PClassActor::AllActorClasses.Size(); ++i)
		{
			PClass *type = PClassActor::AllActorClasses[i];

			if (type->ParentClass == RUNTIME_CLASS (AAmmo))
			{
				AInventory *ammo = player->mo->FindInventory(static_cast<PClassActor *>(type));

				if (ammo)
					ammo->DepleteOrDestroy();
			}
		}

		if (!takeall)
			return;
	}

	if (takeall || stricmp (name, "armor") == 0)
	{
		for (unsigned int i = 0; i < PClassActor::AllActorClasses.Size(); ++i)
		{
			type = PClassActor::AllActorClasses[i];

			if (type->IsDescendantOf (RUNTIME_CLASS (AArmor)))
			{
				AInventory *armor = player->mo->FindInventory(static_cast<PClassActor *>(type));

				if (armor)
					armor->DepleteOrDestroy();
			}
		}

		if (!takeall)
			return;
	}

	if (takeall || stricmp (name, "keys") == 0)
	{
		for (unsigned int i = 0; i < PClassActor::AllActorClasses.Size(); ++i)
		{
			type = PClassActor::AllActorClasses[i];

			if (type->IsDescendantOf (RUNTIME_CLASS (AKey)))
			{
				AActor *key = player->mo->FindInventory(static_cast<PClassActor *>(type));

				if (key)
					key->Destroy ();
			}
		}

		if (!takeall)
			return;
	}

	if (takeall || stricmp (name, "weapons") == 0)
	{
		for (unsigned int i = 0; i < PClassActor::AllActorClasses.Size(); ++i)
		{
			type = PClassActor::AllActorClasses[i];

			if (type != RUNTIME_CLASS(AWeapon) &&
				type->IsDescendantOf (RUNTIME_CLASS (AWeapon)))
			{
				AActor *weapon = player->mo->FindInventory(static_cast<PClassActor *>(type));

				if (weapon)
					weapon->Destroy ();

				player->ReadyWeapon = nullptr;
				player->PendingWeapon = WP_NOCHANGE;
			}
		}

		if (!takeall)
			return;
	}

	if (takeall || stricmp (name, "artifacts") == 0)
	{
		for (unsigned int i = 0; i < PClassActor::AllActorClasses.Size(); ++i)
		{
			type = PClassActor::AllActorClasses[i];

			if (type->IsDescendantOf (RUNTIME_CLASS (AInventory)))
			{
				if (!type->IsDescendantOf (RUNTIME_CLASS (APuzzleItem)) &&
					!type->IsDescendantOf (RUNTIME_CLASS (APowerup)) &&
					!type->IsDescendantOf (RUNTIME_CLASS (AArmor)) &&
					!type->IsDescendantOf (RUNTIME_CLASS (AWeapon)) &&
					!type->IsDescendantOf (RUNTIME_CLASS (AKey)))
				{
					AActor *artifact = player->mo->FindInventory(static_cast<PClassActor *>(type));

					if (artifact)
						artifact->Destroy ();
				}
			}
		}

		if (!takeall)
			return;
	}

	if (takeall || stricmp (name, "puzzlepieces") == 0)
	{
		for (unsigned int i = 0; i < PClassActor::AllActorClasses.Size(); ++i)
		{
			type = PClassActor::AllActorClasses[i];

			if (type->IsDescendantOf (RUNTIME_CLASS (APuzzleItem)))
			{
				AActor *puzzlepiece = player->mo->FindInventory(static_cast<PClassActor *>(type));

				if (puzzlepiece)
					puzzlepiece->Destroy ();
			}
		}

		if (!takeall)
			return;
	}

	if (takeall)
		return;

	type = PClass::FindActor (name);
	if (type == NULL || !type->IsDescendantOf (RUNTIME_CLASS (AInventory)))
	{
		if (player == &players[consoleplayer])
			Printf ("Unknown item \"%s\"\n", name);
	}
	else
	{
		player->mo->TakeInventory(type, amount ? amount : 1);
	}
	return;
}